

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_RehashZeroForcesRehash_Test::~Table_RehashZeroForcesRehash_Test
          (Table_RehashZeroForcesRehash_Test *this)

{
  Table_RehashZeroForcesRehash_Test *this_local;
  
  ~Table_RehashZeroForcesRehash_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, RehashZeroForcesRehash) {
  IntTable t;
  t.emplace(0);
  t.emplace(1);
  auto* p = &*t.find(0);
  t.rehash(0);
  EXPECT_NE(p, &*t.find(0));
}